

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *ret)

{
  ulong uVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *in_RDI;
  Deserializer *in_stack_00000008;
  unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *in_stack_ffffffffffffffd0
  ;
  
  uVar1 = (**(code **)((long)&((in_RDI->
                               super_unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>_>
                               )._M_t.
                               super___uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>
                               .super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl)->c2 +
                      0x18))(in_RDI,in_SI,in_RDX,in_SI);
  if ((uVar1 & 1) == 0) {
    SerializationDefaultValue::
    GetDefault<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>();
    unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>::operator=
              (in_stack_ffffffffffffffd0,in_RDI);
    unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)0x73d45e);
    (**(code **)((in_RDI->super_unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>_>).
                 _M_t.super___uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>.
                 super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl + 1))(in_RDI,0);
  }
  else {
    Read<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,duckdb::Complex>
              (in_stack_00000008);
    unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>::operator=
              (in_stack_ffffffffffffffd0,in_RDI);
    unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)0x73d493);
    (**(code **)((in_RDI->super_unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>_>).
                 _M_t.super___uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>.
                 super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl + 1))(in_RDI,1);
  }
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}